

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt.h
# Opt level: O0

void clnt_destroy_it(CLIENT *clnt,char *tag,int line)

{
  uint16_t uVar1;
  uint16_t flags;
  int line_local;
  char *tag_local;
  CLIENT *clnt_local;
  
  uVar1 = atomic_postset_uint16_t_bits(&clnt->cl_flags,0x20);
  if ((__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s: %p %d @%s:%d","clnt_destroy_it",clnt,(ulong)(uint)clnt->cl_refcnt,tag,
               (ulong)(uint)line);
  }
  if ((uVar1 & 0x20) == 0) {
    clnt_release_it(clnt,0,tag,line);
  }
  return;
}

Assistant:

static inline void clnt_destroy_it(CLIENT *clnt,
				   const char *tag, const int line)
{
	uint16_t flags = atomic_postset_uint16_t_bits(&clnt->cl_flags,
						      CLNT_FLAG_DESTROYING);

	__warnx(TIRPC_DEBUG_FLAG_REFCNT, "%s: %p %" PRId32 " @%s:%d",
		__func__, clnt, clnt->cl_refcnt, tag, line);

	if (flags & CLNT_FLAG_DESTROYING) {
		/* previously set, do nothing */
		return;
	}

	clnt_release_it(clnt, CLNT_RELEASE_FLAG_NONE, tag, line);
}